

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestCopy(void)

{
  bool bVar1;
  long lVar2;
  exception *e_1;
  InputBuffer ib_4;
  BufferReader br_4;
  exception *e;
  BufferReader br_3;
  InputBuffer ib_3;
  OutputBuffer wb_3;
  size_type bufsize_2;
  InputBuffer ib_2;
  BufferReader br_2;
  uint i;
  OutputBuffer wb_2;
  size_type bufsize_1;
  InputBuffer ib_1;
  BufferReader br_1;
  OutputBuffer wb_1;
  size_type bufsize;
  InputBuffer ib;
  BufferReader br;
  OutputBuffer wb;
  string msg;
  lazy_ostream *in_stack_ffffffffffffe638;
  char *pcVar3;
  undefined8 uVar4;
  basic_cstring<const_char> *in_stack_ffffffffffffe640;
  char *in_stack_ffffffffffffe648;
  BufferReader *in_stack_ffffffffffffe650;
  undefined7 in_stack_ffffffffffffe658;
  undefined1 in_stack_ffffffffffffe65f;
  OutputBuffer *in_stack_ffffffffffffe660;
  size_t in_stack_ffffffffffffe668;
  undefined7 in_stack_ffffffffffffe678;
  undefined1 in_stack_ffffffffffffe67f;
  size_type in_stack_ffffffffffffe680;
  lazy_ostream *in_stack_ffffffffffffe688;
  unit_test_log_t *in_stack_ffffffffffffe690;
  unit_test_log_t *this;
  begin *in_stack_ffffffffffffe6a8;
  undefined7 in_stack_ffffffffffffe6b0;
  undefined1 in_stack_ffffffffffffe6b7;
  BufferReader *in_stack_ffffffffffffe6b8;
  InputBuffer *in_stack_ffffffffffffe7e0;
  size_type local_1438;
  basic_cstring<const_char> local_1430;
  undefined1 local_1420 [56];
  basic_cstring<const_char> local_13e8;
  undefined1 local_13d4 [28];
  undefined1 local_13b8 [56];
  basic_cstring<const_char> local_1380;
  undefined1 local_1370 [24];
  undefined1 local_1358 [56];
  basic_cstring<const_char> local_1320;
  undefined1 local_130c [28];
  undefined1 local_12f0 [56];
  basic_cstring<const_char> local_12b8;
  undefined1 local_12a8 [24];
  undefined1 local_1290 [56];
  basic_cstring<const_char> local_1258 [13];
  size_type local_1188;
  basic_cstring<const_char> local_1180;
  undefined1 local_1170 [56];
  basic_cstring<const_char> local_1138;
  undefined1 local_1124 [28];
  undefined1 local_1108 [56];
  basic_cstring<const_char> local_10d0;
  undefined1 local_10c0 [24];
  undefined1 local_10a8 [56];
  basic_cstring<const_char> local_1070 [2];
  undefined1 local_1050 [12];
  int local_1044;
  basic_cstring<const_char> local_1040;
  undefined1 local_1030 [56];
  basic_cstring<const_char> local_ff8;
  undefined1 local_fe4 [28];
  undefined1 local_fc8 [56];
  basic_cstring<const_char> local_f90;
  size_type local_f80;
  basic_cstring<const_char> local_f78;
  undefined1 local_f68 [56];
  basic_cstring<const_char> local_f30;
  undefined1 local_f20 [24];
  undefined1 local_f08 [56];
  basic_cstring<const_char> local_ed0;
  undefined1 local_ebc [28];
  undefined1 local_ea0 [56];
  basic_cstring<const_char> local_e68 [6];
  undefined1 local_e00 [24];
  undefined1 local_de8 [56];
  basic_cstring<const_char> local_db0;
  undefined1 local_da0 [24];
  undefined1 local_d88 [56];
  basic_cstring<const_char> local_d50;
  undefined1 local_d3c [28];
  undefined1 local_d20 [56];
  basic_cstring<const_char> local_ce8;
  size_type local_cd8;
  basic_cstring<const_char> local_cd0;
  undefined1 local_cc0 [56];
  basic_cstring<const_char> local_c88;
  uint local_c74;
  undefined1 local_c60 [16];
  iterator local_c50;
  basic_cstring<const_char> local_c48;
  undefined1 local_c38 [56];
  basic_cstring<const_char> local_c00;
  undefined1 local_bf0 [24];
  undefined1 local_bd8 [56];
  basic_cstring<const_char> local_ba0;
  basic_cstring<const_char> local_b90;
  basic_cstring<const_char> local_b80;
  undefined1 local_b70 [56];
  basic_cstring<const_char> local_b38;
  basic_cstring<const_char> local_b28;
  basic_cstring<const_char> local_b18;
  undefined1 local_b08 [56];
  basic_cstring<const_char> local_ad0;
  undefined1 local_ac0 [24];
  undefined1 local_aa8 [56];
  basic_cstring<const_char> local_a70;
  basic_cstring<const_char> local_a60;
  basic_cstring<const_char> local_a50;
  undefined1 local_a40 [56];
  basic_cstring<const_char> local_a08;
  basic_cstring<const_char> local_9f8;
  basic_cstring<const_char> local_9e8;
  undefined1 local_9d8 [56];
  basic_cstring<const_char> local_9a0;
  undefined1 local_990 [24];
  undefined1 local_978 [56];
  basic_cstring<const_char> local_940;
  undefined1 local_930 [24];
  undefined1 local_918 [56];
  basic_cstring<const_char> local_8e0;
  basic_cstring<const_char> local_8d0;
  basic_cstring<const_char> local_8c0;
  undefined1 local_8b0 [56];
  basic_cstring<const_char> local_878;
  basic_cstring<const_char> local_868;
  basic_cstring<const_char> local_858;
  undefined1 local_848 [56];
  basic_cstring<const_char> local_810;
  undefined1 local_800 [24];
  undefined1 local_7e8 [56];
  basic_cstring<const_char> local_7b0 [6];
  basic_cstring<const_char> local_748;
  basic_cstring<const_char> local_738;
  undefined1 local_728 [56];
  basic_cstring<const_char> local_6f0;
  undefined1 local_6e0 [24];
  undefined1 local_6c8 [56];
  basic_cstring<const_char> local_690;
  basic_cstring<const_char> local_680;
  basic_cstring<const_char> local_670;
  undefined1 local_660 [56];
  basic_cstring<const_char> local_628;
  size_type local_618;
  basic_cstring<const_char> local_610;
  undefined1 local_600 [56];
  basic_cstring<const_char> local_5c8;
  undefined1 local_5b8 [24];
  undefined1 local_5a0 [56];
  basic_cstring<const_char> local_568 [2];
  undefined1 local_548 [16];
  iterator local_538;
  basic_cstring<const_char> local_530;
  undefined1 local_520 [56];
  basic_cstring<const_char> local_4e8;
  undefined1 local_4d8 [24];
  undefined1 local_4c0 [56];
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  basic_cstring<const_char> local_468;
  undefined1 local_458 [56];
  basic_cstring<const_char> local_420;
  basic_cstring<const_char> local_410;
  basic_cstring<const_char> local_400;
  undefined1 local_3f0 [56];
  basic_cstring<const_char> local_3b8;
  undefined1 local_3a8 [24];
  undefined1 local_390 [56];
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  undefined1 local_328 [56];
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  undefined1 local_2c0 [56];
  basic_cstring<const_char> local_288;
  undefined1 local_278 [24];
  undefined1 local_260 [56];
  basic_cstring<const_char> local_228 [6];
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  undefined1 local_1a0 [56];
  basic_cstring<const_char> local_168;
  undefined1 local_158 [24];
  undefined1 local_140 [56];
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  undefined1 local_d8 [56];
  basic_cstring<const_char> local_a0 [2];
  string local_80 [80];
  basic_cstring<const_char> local_30 [3];
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            ((begin *)in_stack_ffffffffffffe650,(const_string *)in_stack_ffffffffffffe648,
             (size_t)in_stack_ffffffffffffe640);
  boost::unit_test::unit_test_log_t::operator<<
            ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe6b7,in_stack_ffffffffffffe6b0),
             in_stack_ffffffffffffe6a8);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)in_stack_ffffffffffffe648,
             (log_level)((ulong)in_stack_ffffffffffffe640 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [9])in_stack_ffffffffffffe640);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[9],_const_char_(&)[9]>::
  ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[9],_const_char_(&)[9]>
                      *)0x238254);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)in_stack_ffffffffffffe640);
  makeString_abi_cxx11_(in_stack_ffffffffffffe668);
  std::operator<<((ostream *)&std::cout,"Test1\n");
  avro::OutputBuffer::OutputBuffer
            (in_stack_ffffffffffffe660,CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658)
            );
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_ffffffffffffe640,(data_type *)in_stack_ffffffffffffe638,
             0x2382dd);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_f8.m_end = (iterator)std::__cxx11::string::size();
    local_f8.m_begin = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x2383a8);
    in_stack_ffffffffffffe648 = "wb.size()";
    in_stack_ffffffffffffe640 = &local_f8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_d8,&local_e8,0x358,1,2,&local_f8.m_end,"msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238422);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_158 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_158._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x2384f5);
    local_158._0_4_ = 1;
    in_stack_ffffffffffffe648 = "1";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_158;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_140,local_158 + 8,0x359,1,2,local_158 + 4,"wb.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238577);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    lVar2 = std::__cxx11::string::size();
    local_1c0.m_end = (iterator)(0x1000 - lVar2);
    local_1c0.m_begin = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x23866a);
    in_stack_ffffffffffffe648 = "wb.freeSpace()";
    in_stack_ffffffffffffe640 = &local_1c0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1a0,&local_1b0,0x35b,1,2,&local_1c0.m_end,"kDefaultBlockSize - msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2386e4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::BufferReader::BufferReader
            (in_stack_ffffffffffffe650,(OutputBuffer *)in_stack_ffffffffffffe648);
  avro::BufferReader::seek
            ((BufferReader *)CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),
             (size_type)in_stack_ffffffffffffe650);
  std::__cxx11::string::size();
  avro::BufferReader::copyData
            (in_stack_ffffffffffffe6b8,CONCAT17(in_stack_ffffffffffffe6b7,in_stack_ffffffffffffe6b0)
            );
  printBuffer(in_stack_ffffffffffffe7e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_278 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_278._4_4_ = avro::InputBuffer::numChunks((InputBuffer *)0x23881c);
    local_278._0_4_ = 1;
    in_stack_ffffffffffffe648 = "1";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_278;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_260,local_278 + 8,0x364,1,2,local_278 + 4,"ib.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23889e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_2e0.m_end = (iterator)avro::InputBuffer::size((InputBuffer *)0x238971);
    lVar2 = std::__cxx11::string::size();
    local_2e0.m_begin = (iterator)(lVar2 + -10);
    in_stack_ffffffffffffe648 = "msg.size()-10";
    in_stack_ffffffffffffe640 = &local_2e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_2c0,&local_2d0,0x365,1,2,&local_2e0.m_end,"ib.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238a04);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_348.m_end = (iterator)std::__cxx11::string::size();
    local_348.m_begin = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x238aec);
    in_stack_ffffffffffffe648 = "wb.size()";
    in_stack_ffffffffffffe640 = &local_348;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_328,&local_338,0x368,1,2,&local_348.m_end,"msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238b66);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_358,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3a8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_3a8._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x238c39);
    local_3a8._0_4_ = 1;
    in_stack_ffffffffffffe648 = "1";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_3a8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_390,local_3a8 + 8,0x369,1,2,local_3a8 + 4,"wb.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238cbb);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_400,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    lVar2 = std::__cxx11::string::size();
    local_410.m_end = (iterator)(0x1000 - lVar2);
    local_410.m_begin = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x238dae);
    in_stack_ffffffffffffe648 = "wb.freeSpace()";
    in_stack_ffffffffffffe640 = &local_410;
    pcVar3 = "kDefaultBlockSize - msg.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_3f0,&local_400,0x36b,1,2,&local_410.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238e28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::reserve((OutputBuffer *)in_stack_ffffffffffffe640,(size_type)pcVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_420,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_468,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_478.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x238f0f);
    local_478.m_begin = (iterator)std::__cxx11::string::size();
    in_stack_ffffffffffffe648 = "msg.size()";
    in_stack_ffffffffffffe640 = &local_478;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_458,&local_468,0x36f,1,2,&local_478.m_end,"wb.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x238f9e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4d8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_4d8._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x239071);
    local_4d8._0_4_ = 2;
    in_stack_ffffffffffffe648 = "2";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_4d8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_4c0,local_4d8 + 8,0x370,1,2,local_4d8 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2390f3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    lVar2 = std::__cxx11::string::size();
    local_538 = (iterator)(0x2000 - lVar2);
    local_548._8_8_ = avro::OutputBuffer::freeSpace((OutputBuffer *)0x2391e6);
    in_stack_ffffffffffffe648 = "wb.freeSpace()";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)(local_548 + 8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_520,&local_530,0x372,1,2,&local_538,"kDefaultBlockSize * 2 - msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239260);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23928c);
  avro::BufferReader::~BufferReader((BufferReader *)0x239299);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x2392a6);
  std::operator<<((ostream *)&std::cout,"Test2\n");
  local_548._0_8_ = (iterator)0xc000;
  avro::OutputBuffer::OutputBuffer
            (in_stack_ffffffffffffe660,CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_568,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_5b8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_5b8._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x23938f);
    local_5b8._0_4_ = 3;
    in_stack_ffffffffffffe648 = "3";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_5b8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_5a0,local_5b8 + 8,0x37c,1,2,local_5b8 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239411);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_610,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_618 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x2394e4);
    in_stack_ffffffffffffe648 = "bufsize";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_548;
    pcVar3 = "wb.freeSpace()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_600,&local_610,0x37d,1,2,&local_618);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23955e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  avro::OutputBuffer::writeTo((OutputBuffer *)in_stack_ffffffffffffe640,pcVar3,0x2395bf);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_670,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_680.m_end = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x239675);
    local_680.m_begin = (iterator)std::__cxx11::string::size();
    in_stack_ffffffffffffe648 = "msg.size()";
    in_stack_ffffffffffffe640 = &local_680;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_660,&local_670,0x381,1,2,&local_680.m_end,"wb.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239704);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_690,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_6e0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_6e0._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x2397d7);
    local_6e0._0_4_ = 1;
    in_stack_ffffffffffffe648 = "1";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_6e0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_6c8,local_6e0 + 8,0x382,1,2,local_6e0 + 4,"wb.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239859);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_738,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    lVar2 = std::__cxx11::string::size();
    local_748.m_end = (iterator)(0xc000 - lVar2);
    local_748.m_begin = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x23994c);
    in_stack_ffffffffffffe648 = "wb.freeSpace()";
    in_stack_ffffffffffffe640 = &local_748;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_728,&local_738,900,1,2,&local_748.m_end,"bufsize - msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2399c6);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::BufferReader::BufferReader
            (in_stack_ffffffffffffe650,(OutputBuffer *)in_stack_ffffffffffffe648);
  avro::BufferReader::seek
            ((BufferReader *)CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),
             (size_type)in_stack_ffffffffffffe650);
  std::__cxx11::string::size();
  avro::BufferReader::copyData
            (in_stack_ffffffffffffe6b8,CONCAT17(in_stack_ffffffffffffe6b7,in_stack_ffffffffffffe6b0)
            );
  printBuffer(in_stack_ffffffffffffe7e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_7b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_800 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_800._4_4_ = avro::InputBuffer::numChunks((InputBuffer *)0x239afe);
    local_800._0_4_ = 1;
    in_stack_ffffffffffffe648 = "1";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_800;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_7e8,local_800 + 8,0x38c,1,2,local_800 + 4,"ib.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239b80);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_810,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_858,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_868.m_end = (iterator)avro::InputBuffer::size((InputBuffer *)0x239c53);
    lVar2 = std::__cxx11::string::size();
    local_868.m_begin = (iterator)(lVar2 + -10);
    in_stack_ffffffffffffe648 = "msg.size()-10";
    in_stack_ffffffffffffe640 = &local_868;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_848,&local_858,0x38d,1,2,&local_868.m_end,"ib.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239ce6);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_878,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_8d0.m_end = (iterator)std::__cxx11::string::size();
    local_8d0.m_begin = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x239dce);
    in_stack_ffffffffffffe648 = "wb.size()";
    in_stack_ffffffffffffe640 = &local_8d0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_8b0,&local_8c0,0x390,1,2,&local_8d0.m_end,"msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239e48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_930 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_930._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x239f1b);
    local_930._0_4_ = 3;
    in_stack_ffffffffffffe648 = "3";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_930;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_918,local_930 + 8,0x391,1,2,local_930 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x239f9d);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_940,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_990 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_990._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x23a070);
    local_990._0_4_ = 1;
    in_stack_ffffffffffffe648 = "1";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_990;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_978,local_990 + 8,0x392,1,2,local_990 + 4,"wb.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23a0f2);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    lVar2 = std::__cxx11::string::size();
    local_9f8.m_end = (iterator)(0xc000 - lVar2);
    local_9f8.m_begin = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x23a1e5);
    in_stack_ffffffffffffe648 = "wb.freeSpace()";
    in_stack_ffffffffffffe640 = &local_9f8;
    pcVar3 = "bufsize - msg.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_9d8,&local_9e8,0x393,1,2,&local_9f8.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23a25f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::reserve((OutputBuffer *)in_stack_ffffffffffffe640,(size_type)pcVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a08,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a50,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_a60.m_end = (iterator)std::__cxx11::string::size();
    local_a60.m_begin = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x23a35b);
    in_stack_ffffffffffffe648 = "wb.size()";
    in_stack_ffffffffffffe640 = &local_a60;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_a40,&local_a50,0x397,1,2,&local_a60.m_end,"msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23a3d5);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a70,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_ac0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_ac0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x23a4a8);
    local_ac0._0_4_ = 3;
    in_stack_ffffffffffffe648 = "3";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_ac0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_aa8,local_ac0 + 8,0x398,1,2,local_ac0 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23a52a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ad0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b18,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    lVar2 = std::__cxx11::string::size();
    local_b28.m_end = (iterator)(0xc000 - lVar2);
    local_b28.m_begin = (iterator)avro::OutputBuffer::freeSpace((OutputBuffer *)0x23a61d);
    in_stack_ffffffffffffe648 = "wb.freeSpace()";
    in_stack_ffffffffffffe640 = &local_b28;
    pcVar3 = "bufsize - msg.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_b08,&local_b18,0x399,1,2,&local_b28.m_end);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23a697);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::OutputBuffer::reserve((OutputBuffer *)in_stack_ffffffffffffe640,(size_type)pcVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b38,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_b90.m_end = (iterator)std::__cxx11::string::size();
    local_b90.m_begin = (iterator)avro::OutputBuffer::size((OutputBuffer *)0x23a793);
    in_stack_ffffffffffffe648 = "wb.size()";
    in_stack_ffffffffffffe640 = &local_b90;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_b70,&local_b80,0x39d,1,2,&local_b90.m_end,"msg.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23a80d);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ba0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_bf0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_bf0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x23a8e0);
    local_bf0._0_4_ = 4;
    in_stack_ffffffffffffe648 = "4";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_bf0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_bd8,local_bf0 + 8,0x39e,1,2,local_bf0 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23a962);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c48,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    lVar2 = std::__cxx11::string::size();
    local_c50 = (iterator)(0xd000 - lVar2);
    local_c60._8_8_ = avro::OutputBuffer::freeSpace((OutputBuffer *)0x23aa55);
    in_stack_ffffffffffffe648 = "wb.freeSpace()";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)(local_c60 + 8);
    uVar4 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_c38,&local_c48,0x3a0,1,2,&local_c50);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23aacf);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23aafb);
  avro::BufferReader::~BufferReader((BufferReader *)0x23ab08);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23ab15);
  std::operator<<((ostream *)&std::cout,"Test3\n");
  local_c60._0_8_ = (iterator)0x2000;
  avro::OutputBuffer::OutputBuffer
            (in_stack_ffffffffffffe660,CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658)
            );
  for (local_c74 = 0; local_c74 < 0x2000; local_c74 = local_c74 + 1) {
    avro::OutputBuffer::writeTo<char>
              ((OutputBuffer *)in_stack_ffffffffffffe640,(char)((ulong)uVar4 >> 0x38));
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cd0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_cd8 = avro::OutputBuffer::size((OutputBuffer *)0x23b1b9);
    in_stack_ffffffffffffe648 = "bufsize";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_c60;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_cc0,&local_cd0,0x3ad,1,2,&local_cd8,"wb.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23b233);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ce8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_d3c + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_d3c._4_8_ = avro::OutputBuffer::freeSpace((OutputBuffer *)0x23b306);
    local_d3c._0_4_ = 0;
    in_stack_ffffffffffffe648 = "0U";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_d3c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_d20,local_d3c + 0xc,0x3ae,1,2,local_d3c + 4,"wb.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23b38b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d50,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_da0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_da0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x23b45e);
    local_da0._0_4_ = 0;
    in_stack_ffffffffffffe648 = "0";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_da0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_d88,local_da0 + 8,0x3af,1,2,local_da0 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23b4e0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_db0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_e00 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_e00._4_4_ = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x23b5b3);
    local_e00._0_4_ = 2;
    in_stack_ffffffffffffe648 = "2";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_e00;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_de8,local_e00 + 8,0x3b0,1,2,local_e00 + 4,"wb.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23b635);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::BufferReader::BufferReader
            (in_stack_ffffffffffffe650,(OutputBuffer *)in_stack_ffffffffffffe648);
  avro::BufferReader::seek
            ((BufferReader *)CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),
             (size_type)in_stack_ffffffffffffe650);
  avro::BufferReader::copyData
            (in_stack_ffffffffffffe6b8,CONCAT17(in_stack_ffffffffffffe6b7,in_stack_ffffffffffffe6b0)
            );
  printBuffer(in_stack_ffffffffffffe7e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_e68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_ebc + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_ebc._4_8_ = avro::InputBuffer::size((InputBuffer *)0x23b75e);
    local_ebc._0_4_ = 0x14;
    in_stack_ffffffffffffe648 = "20U";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_ebc;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_ea0,local_ebc + 0xc,0x3b9,1,2,local_ebc + 4,"ib.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23b7e3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ed0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_f20 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_f20._4_4_ = avro::InputBuffer::numChunks((InputBuffer *)0x23b8b6);
    local_f20._0_4_ = 2;
    in_stack_ffffffffffffe648 = "2";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_f20;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_f08,local_f20 + 8,0x3ba,1,2,local_f20 + 4,"ib.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23b938);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f30,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_f80 = avro::OutputBuffer::size((OutputBuffer *)0x23ba0b);
    in_stack_ffffffffffffe648 = "bufsize";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_c60;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_f68,&local_f78,0x3bd,1,2,&local_f80,"wb.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23ba85);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_fe4 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_fe4._4_8_ = avro::OutputBuffer::freeSpace((OutputBuffer *)0x23bb58);
    local_fe4._0_4_ = 0;
    in_stack_ffffffffffffe648 = "0U";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_fe4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_fc8,local_fe4 + 0xc,0x3be,1,2,local_fe4 + 4,"wb.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23bbdd);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ff8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1040,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1044 = avro::OutputBuffer::numDataChunks((OutputBuffer *)0x23bcb0);
    local_1050._8_4_ = 2;
    in_stack_ffffffffffffe648 = "2";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)(local_1050 + 8);
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1030,&local_1040,0x3bf,1,2,&local_1044,"wb.numDataChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23bd32);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23bd5e);
  avro::BufferReader::~BufferReader((BufferReader *)0x23bd6b);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23bd78);
  local_1050._0_8_ = (iterator)0x8000;
  std::operator<<((ostream *)&std::cout,"Test4\n");
  avro::OutputBuffer::OutputBuffer
            (in_stack_ffffffffffffe660,CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658)
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1070,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_10c0 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_10c0._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x23be61);
    local_10c0._0_4_ = 2;
    in_stack_ffffffffffffe648 = "2";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_10c0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_10a8,local_10c0 + 8,0x3c7,1,2,local_10c0 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23bee3);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1124 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1124._4_8_ = avro::OutputBuffer::size((OutputBuffer *)0x23bfb6);
    local_1124._0_4_ = 0;
    in_stack_ffffffffffffe648 = "0U";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_1124;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1108,local_1124 + 0xc,0x3c8,1,2,local_1124 + 4,"wb.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23c03b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1138,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1180,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1188 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x23c10e);
    in_stack_ffffffffffffe648 = "bufsize";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_1050;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1170,&local_1180,0x3c9,1,2,&local_1188,"wb.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23c188);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::InputBuffer::InputBuffer((InputBuffer *)in_stack_ffffffffffffe650);
  avro::BufferReader::BufferReader
            (in_stack_ffffffffffffe650,(OutputBuffer *)in_stack_ffffffffffffe648);
  avro::BufferReader::seek
            ((BufferReader *)CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),
             (size_type)in_stack_ffffffffffffe650);
  avro::BufferReader::~BufferReader((BufferReader *)0x23c1ee);
  avro::BufferReader::BufferReader
            (in_stack_ffffffffffffe650,(OutputBuffer *)in_stack_ffffffffffffe648);
  avro::BufferReader::copyData
            (in_stack_ffffffffffffe6b8,CONCAT17(in_stack_ffffffffffffe6b7,in_stack_ffffffffffffe6b0)
            );
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23c52b);
  avro::BufferReader::~BufferReader((BufferReader *)0x23c538);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_12a8 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_12a8._4_4_ = avro::InputBuffer::numChunks((InputBuffer *)0x23c6f1);
    local_12a8._0_4_ = 0;
    in_stack_ffffffffffffe648 = "0";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_12a8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1290,local_12a8 + 8,0x3dc,1,2,local_12a8 + 4,"ib.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23c773);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_130c + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_130c._4_8_ = avro::InputBuffer::size((InputBuffer *)0x23c846);
    local_130c._0_4_ = 0;
    in_stack_ffffffffffffe648 = "0U";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_130c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_12f0,local_130c + 0xc,0x3dd,1,2,local_130c + 4,"ib.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23c8cb);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1320,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffe690,(const_string *)in_stack_ffffffffffffe688,
               in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1370 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1370._4_4_ = avro::OutputBuffer::numChunks((OutputBuffer *)0x23c98c);
    local_1370._0_4_ = 2;
    in_stack_ffffffffffffe648 = "2";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_1370;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1358,local_1370 + 8,0x3e0,1,2,local_1370 + 4,"wb.numChunks()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23ca08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1380,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,(const_string *)in_stack_ffffffffffffe688,in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    in_stack_ffffffffffffe688 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_13d4 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_ffffffffffffe680 = avro::OutputBuffer::size((OutputBuffer *)0x23cac9);
    local_13d4._0_4_ = 0;
    in_stack_ffffffffffffe648 = "0U";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_13d4;
    local_13d4._4_8_ = in_stack_ffffffffffffe680;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_13b8,local_13d4 + 0xc,0x3e1,1,2,local_13d4 + 4,"wb.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23cb48);
    in_stack_ffffffffffffe67f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe67f);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffe640);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this,(const_string *)in_stack_ffffffffffffe688,in_stack_ffffffffffffe680,
               (const_string *)CONCAT17(in_stack_ffffffffffffe67f,in_stack_ffffffffffffe678));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe648,(char (*) [1])in_stack_ffffffffffffe640);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1430,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_1438 = avro::OutputBuffer::freeSpace((OutputBuffer *)0x23cc09);
    in_stack_ffffffffffffe648 = "bufsize";
    in_stack_ffffffffffffe640 = (basic_cstring<const_char> *)local_1050;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1420,&local_1430,0x3e2,1,2,&local_1438,"wb.freeSpace()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x23cc7d);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::InputBuffer::~InputBuffer((InputBuffer *)0x23cca3);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x23ccb0);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

void TestCopy() 
{
    BOOST_TEST_MESSAGE( "TestCopy");

    const std::string msg = makeString(30);
    // Test1, small data, small buffer
    {
        std::cout << "Test1\n";
        // put a small amount of data in the buffer
        avro::OutputBuffer wb;

        wb.writeTo(msg.c_str(), msg.size());

        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(kDefaultBlockSize - msg.size(), 
                wb.freeSpace());

        // copy starting at offset 5 and copying 10 less bytes
        BufferReader br(wb);
        br.seek(5);
        avro::InputBuffer ib = br.copyData(msg.size() - 10);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.numChunks(), 1);
        BOOST_CHECK_EQUAL(ib.size(), msg.size()-10);

        // buf 1 should be unchanged
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(kDefaultBlockSize - msg.size(), 
                wb.freeSpace());

        // make sure wb is still functional
        wb.reserve(kDefaultBlockSize);
        BOOST_CHECK_EQUAL(wb.size(), msg.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(kDefaultBlockSize * 2 - msg.size(), 
                wb.freeSpace());
    }

    // Test2, small data, large buffer
    {
        std::cout << "Test2\n";
        // put a small amount of data in the buffer
        const OutputBuffer::size_type bufsize= 3*kMaxBlockSize;

        avro::OutputBuffer wb(bufsize);
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);

        wb.writeTo(msg.c_str(), msg.size());

        BOOST_CHECK_EQUAL(wb.size(), msg.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), 
                wb.freeSpace());

        BufferReader br(wb);
        br.seek(5);
        avro::InputBuffer ib = br.copyData(msg.size() - 10);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.numChunks(), 1);
        BOOST_CHECK_EQUAL(ib.size(), msg.size()-10);

        // wb should be unchanged
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), wb.freeSpace());

        // reserving a small amount should have no effect
        wb.reserve(1);
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), wb.freeSpace());

        // reserve more (will get extra block)
        wb.reserve(bufsize);
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 4);
        BOOST_CHECK_EQUAL(kMaxBlockSize * 3 - msg.size() + kMinBlockSize, 
                wb.freeSpace());
    }

    // Test3 Border case, buffer is exactly full
    {
        std::cout << "Test3\n";
        const OutputBuffer::size_type bufsize= 2*kDefaultBlockSize;
        avro::OutputBuffer wb;

        for(unsigned i = 0; i < bufsize; ++i) {
            wb.writeTo('a');
        }

        BOOST_CHECK_EQUAL(wb.size(), bufsize);
        BOOST_CHECK_EQUAL(wb.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(wb.numChunks(), 0);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 2);

        // copy where the chunks overlap
        BufferReader br(wb);
        br.seek(bufsize/2 - 10);
        avro::InputBuffer ib = br.copyData(20);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.size(), 20U);
        BOOST_CHECK_EQUAL(ib.numChunks(), 2);

        // wb should be unchanged
        BOOST_CHECK_EQUAL(wb.size(), bufsize);
        BOOST_CHECK_EQUAL(wb.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 2);
    }

    // Test4, no data 
    {
        const OutputBuffer::size_type bufsize= 2*kMaxBlockSize;
        std::cout << "Test4\n";
        avro::OutputBuffer wb(bufsize);
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(wb.size(), 0U);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);

        avro::InputBuffer ib;
        try {
            BufferReader br(wb);
            br.seek(10);
        }
        catch (std::exception &e) {
            cout << "Intentially triggered exception: " << e.what() << endl;
        }
        try {
            BufferReader br(wb);
            avro::InputBuffer ib = br.copyData(10);
        }
        catch (std::exception &e) {
            cout << "Intentially triggered exception: " << e.what() << endl;
        }


        BOOST_CHECK_EQUAL(ib.numChunks(), 0);
        BOOST_CHECK_EQUAL(ib.size(), 0U);

        // wb should keep all blocks remaining
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(wb.size(), 0U);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);
    }
}